

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O1

void __thiscall
mocker::anon_unknown_5::FindRedundantNodes::operator()(FindRedundantNodes *this,FuncCallExpr *node)

{
  pointer psVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  const_iterator cVar3;
  pointer psVar4;
  
  cVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::find(&this->pureFunc->_M_h,
                 &((node->identifier).
                   super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  val);
  if (cVar3.
      super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    psVar1 = (node->args).
             super__Vector_base<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (psVar4 = (node->args).
                  super__Vector_base<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; psVar4 != psVar1; psVar4 = psVar4 + 1)
    {
      peVar2 = (psVar4->super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      this_00 = (psVar4->super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      (*(peVar2->super_ASTNode)._vptr_ASTNode[3])(peVar2,this);
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
    }
  }
  else {
    this->hasSideEffect = true;
  }
  return;
}

Assistant:

void operator()(const ast::FuncCallExpr &node) const override {
    if (pureFunc.find(node.identifier->val) != pureFunc.end()) {
      hasSideEffect = true;
      return;
    }
    for (auto &arg : node.args)
      visit(arg);
  }